

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

Value * duckdb::DefaultValue(Value *__return_storage_ptr__,ColumnDefinition *def)

{
  undefined1 *puVar1;
  string *psVar2;
  bool bVar3;
  ParsedExpression *pPVar4;
  LogicalType LStack_68;
  string local_50;
  string local_30;
  
  bVar3 = ColumnDefinition::Generated(def);
  if (bVar3) {
    pPVar4 = ColumnDefinition::GeneratedExpression(def);
    (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pPVar4);
    Value::Value(__return_storage_ptr__,&local_30);
    psVar2 = &local_30;
  }
  else {
    bVar3 = ColumnDefinition::HasDefaultValue(def);
    if (!bVar3) {
      LogicalType::LogicalType(&LStack_68,SQLNULL);
      Value::Value(__return_storage_ptr__,&LStack_68);
      LogicalType::~LogicalType(&LStack_68);
      return __return_storage_ptr__;
    }
    pPVar4 = ColumnDefinition::DefaultValue(def);
    (*(pPVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pPVar4);
    Value::Value(__return_storage_ptr__,&local_50);
    psVar2 = &local_50;
  }
  puVar1 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &psVar2->field_2) {
    operator_delete(puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Value DefaultValue(const ColumnDefinition &def) {
	if (def.Generated()) {
		return Value(def.GeneratedExpression().ToString());
	}
	if (!def.HasDefaultValue()) {
		return Value();
	}
	auto &value = def.DefaultValue();
	return Value(value.ToString());
}